

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O3

void anon_unknown.dwarf_ed71d0::gcm_siv_polyval
               (uint8_t *out_tag,uint8_t *in,size_t in_len,uint8_t *ad,size_t ad_len,
               uint8_t *auth_key,uint8_t *nonce)

{
  uint8_t *puVar1;
  size_t i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t length_block [16];
  polyval_ctx polyval_ctx;
  ulong local_188;
  ulong uStack_180;
  uint8_t *local_170;
  long local_168;
  long local_160;
  polyval_ctx local_158;
  
  uVar4 = *(ulong *)auth_key >> 1;
  uVar3 = *(ulong *)(auth_key + 8) >> 1;
  uVar5 = (ulong)(-((uint)*(ulong *)auth_key & 1) & 0xe1) << 0x38 ^ uVar3;
  local_188 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
              | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18
              | (uVar5 & 0xff00) << 0x28 | uVar3 << 0x38;
  uStack_180 = (uVar4 | *(ulong *)(auth_key + 8) << 0x3f) >> 0x38 |
               (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
               (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
               | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  local_170 = in;
  CRYPTO_ghash_init(&local_158.gmult,&local_158.ghash,local_158.Htable,(uint8_t *)&local_188);
  local_158.S[0] = '\0';
  local_158.S[1] = '\0';
  local_158.S[2] = '\0';
  local_158.S[3] = '\0';
  local_158.S[4] = '\0';
  local_158.S[5] = '\0';
  local_158.S[6] = '\0';
  local_158.S[7] = '\0';
  local_158.S[8] = '\0';
  local_158.S[9] = '\0';
  local_158.S[10] = '\0';
  local_158.S[0xb] = '\0';
  local_158.S[0xc] = '\0';
  local_158.S[0xd] = '\0';
  local_158.S[0xe] = '\0';
  local_158.S[0xf] = '\0';
  crypto_polyval_update_blocks(&local_158,ad,ad_len & 0xfffffffffffffff0);
  uVar4 = ad_len & 0xf;
  if (uVar4 != 0) {
    memset((void *)((long)&local_188 + uVar4),0,0x10 - uVar4);
    memcpy(&local_188,ad + (ad_len & 0xfffffffffffffff0),uVar4);
    crypto_polyval_update_blocks(&local_158,(uint8_t *)&local_188,0x10);
  }
  puVar1 = local_170;
  crypto_polyval_update_blocks(&local_158,local_170,in_len & 0xfffffffffffffff0);
  uVar4 = in_len & 0xf;
  if (uVar4 != 0) {
    memset((void *)((long)&local_188 + uVar4),0,0x10 - uVar4);
    memcpy(&local_188,puVar1 + (in_len & 0xfffffffffffffff0),uVar4);
    crypto_polyval_update_blocks(&local_158,(uint8_t *)&local_188,0x10);
  }
  local_168 = ad_len << 3;
  local_160 = in_len << 3;
  crypto_polyval_update_blocks(&local_158,(uint8_t *)&local_168,0x10);
  *(undefined8 *)out_tag = local_158.S._0_8_;
  *(undefined8 *)(out_tag + 8) = local_158.S._8_8_;
  uVar4 = *(ulong *)out_tag;
  uVar3 = *(ulong *)(out_tag + 8);
  *(ulong *)out_tag =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  *(ulong *)(out_tag + 8) =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  lVar2 = 0;
  do {
    out_tag[lVar2] = out_tag[lVar2] ^ nonce[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc);
  out_tag[0xf] = out_tag[0xf] & 0x7f;
  return;
}

Assistant:

void gcm_siv_polyval(uint8_t out_tag[16], const uint8_t *in, size_t in_len,
                     const uint8_t *ad, size_t ad_len,
                     const uint8_t auth_key[16],
                     const uint8_t nonce[EVP_AEAD_AES_GCM_SIV_NONCE_LEN]) {
  struct polyval_ctx polyval_ctx;
  crypto_polyval_init(&polyval_ctx, auth_key);

  crypto_polyval_update_blocks(&polyval_ctx, ad, ad_len & ~15);

  uint8_t scratch[16];
  if (ad_len & 15) {
    OPENSSL_memset(scratch, 0, sizeof(scratch));
    OPENSSL_memcpy(scratch, &ad[ad_len & ~15], ad_len & 15);
    crypto_polyval_update_blocks(&polyval_ctx, scratch, sizeof(scratch));
  }

  crypto_polyval_update_blocks(&polyval_ctx, in, in_len & ~15);
  if (in_len & 15) {
    OPENSSL_memset(scratch, 0, sizeof(scratch));
    OPENSSL_memcpy(scratch, &in[in_len & ~15], in_len & 15);
    crypto_polyval_update_blocks(&polyval_ctx, scratch, sizeof(scratch));
  }

  uint8_t length_block[16];
  CRYPTO_store_u64_le(length_block, ((uint64_t)ad_len) * 8);
  CRYPTO_store_u64_le(length_block + 8, ((uint64_t)in_len) * 8);
  crypto_polyval_update_blocks(&polyval_ctx, length_block,
                               sizeof(length_block));

  crypto_polyval_finish(&polyval_ctx, out_tag);
  for (size_t i = 0; i < EVP_AEAD_AES_GCM_SIV_NONCE_LEN; i++) {
    out_tag[i] ^= nonce[i];
  }
  out_tag[15] &= 0x7f;
}